

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFile.cpp
# Opt level: O0

void __thiscall OutputFile::add(OutputFile *this,string *key_arg,size_t value_arg)

{
  size_t key_arg_00;
  string local_1e0;
  OutputFile *local_1c0 [3];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  ulong local_20;
  size_t value_arg_local;
  string *key_arg_local;
  OutputFile *this_local;
  
  local_20 = value_arg;
  value_arg_local = (size_t)key_arg;
  key_arg_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::ostream::operator<<(local_198,local_20);
  key_arg_00 = value_arg_local;
  std::__cxx11::stringstream::str();
  local_1c0[0] = allocKeyVal((string *)key_arg_00,&local_1e0);
  std::__cxx11::list<OutputFile_*,_std::allocator<OutputFile_*>_>::push_back
            (&this->descendants,local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void
OutputFile::add(const string & key_arg, size_t value_arg) {
  stringstream ss;
  ss << value_arg;
  descendants.push_back(allocKeyVal(key_arg, ss.str()));
}